

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

bool __thiscall Debugger::SourceRunDown(Debugger *this)

{
  JsErrorCode jsErrorCode_00;
  PAL_FILE *pPVar1;
  LPCWSTR pWVar2;
  JsValueRef pvStack_30;
  JsErrorCode jsErrorCode;
  JsValueRef sourcesList;
  AutoRestoreContext autoRestoreContext;
  Debugger *this_local;
  
  autoRestoreContext._8_8_ = this;
  AutoRestoreContext::AutoRestoreContext((AutoRestoreContext *)&sourcesList,this->m_context);
  pvStack_30 = (JsValueRef)0x0;
  jsErrorCode_00 = ChakraRTInterface::JsDiagGetScripts(&stack0xffffffffffffffd0);
  if (jsErrorCode_00 == JsNoError) {
    this_local._7_1_ = CallFunctionNoResult(this,"HandleSourceRunDown",pvStack_30,(JsValueRef)0x0);
  }
  else {
    pPVar1 = PAL_get_stderr(0);
    pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode_00);
    PAL_fwprintf(pPVar1,
                 L"ERROR: ChakraRTInterface::JsDiagGetScripts(&sourcesList) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)jsErrorCode_00,pWVar2);
    pPVar1 = PAL_get_stderr(0);
    PAL_fflush(pPVar1);
    this_local._7_1_ = false;
  }
  AutoRestoreContext::~AutoRestoreContext((AutoRestoreContext *)&sourcesList);
  return this_local._7_1_;
}

Assistant:

bool Debugger::SourceRunDown()
{
    AutoRestoreContext autoRestoreContext(this->m_context);

    JsValueRef sourcesList = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsDiagGetScripts(&sourcesList));

    return this->CallFunctionNoResult("HandleSourceRunDown", sourcesList);
}